

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

bool __thiscall soul::AST::FunctionCall::isResolved(FunctionCall *this)

{
  CommaSeparatedList *pCVar1;
  Expression *pEVar2;
  int iVar3;
  
  pCVar1 = (this->super_CallOrCastBase).arguments.object;
  if ((pCVar1 != (CommaSeparatedList *)0x0) &&
     (iVar3 = (*(pCVar1->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])(),
     (char)iVar3 == '\0')) {
    return false;
  }
  pEVar2 = (this->targetFunction->returnType).object;
  if (pEVar2 == (Expression *)0x0) {
    return true;
  }
  iVar3 = (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[3])();
  return SUB41(iVar3,0);
}

Assistant:

bool isResolved() const override        { return areAllArgumentsResolved() && (targetFunction.returnType == nullptr || targetFunction.returnType->isResolved()); }